

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O1

int __thiscall
datadog::Dogstatsd::count
          (Dogstatsd *this,string *name,int64_t value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,double rate)

{
  pointer pcVar1;
  ostream *poVar2;
  ssize_t sVar3;
  int in_R8D;
  ostringstream statd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::ostream::_M_insert<long>((long)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|c",2);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,tags);
  sVar3 = send(this,(int)local_1e0,local_1c0,(size_t)&local_1f8,in_R8D);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return (int)sVar3;
}

Assistant:

int Dogstatsd::count( std::string name, int64_t value, std::vector<std::string> tags, double rate){
    std::ostringstream statd;
    statd << value << "|c";
    return send(name, statd.str(), tags, rate);
  }